

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

Vector3d * __thiscall OpenMD::Thermo::getHeatFlux(Vector3d *__return_storage_ptr__,Thermo *this)

{
  undefined4 *puVar1;
  double dVar2;
  int iVar3;
  StuntDouble *pSVar4;
  double dVar5;
  RealType RVar6;
  uint i;
  Molecule *pMVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  DataStoragePointer DVar11;
  ulong uVar12;
  long *plVar13;
  Snapshot *pSVar14;
  long lVar15;
  pointer ppSVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  Vector<double,_3U> result_1;
  MoleculeIterator miter;
  Vector<double,_3U> result;
  Mat3x3d I;
  Vector3d local_138;
  double local_118 [4];
  double local_f8;
  double dStack_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  double local_d8;
  Snapshot *local_d0;
  Vector3d *local_c8;
  MoleculeIterator local_c0;
  double local_b8 [4];
  double local_98 [4];
  double local_78 [9];
  
  pSVar14 = this->info_->sman_->currentSnapshot_;
  local_c0._M_node = (_Base_ptr)0x0;
  local_78[8] = 0.0;
  local_78[6] = 0.0;
  local_78[7] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = 0.0;
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_118[2] = (double)OpenMD::V3Zero._16_8_;
  local_118[0] = (double)OpenMD::V3Zero._0_8_;
  local_118[1] = (double)OpenMD::V3Zero._8_8_;
  pMVar7 = SimInfo::beginMolecule(this->info_,&local_c0);
  dVar21 = local_118[0];
  dVar22 = local_118[1];
  dVar20 = local_118[2];
  if (pMVar7 != (Molecule *)0x0) {
    local_d0 = pSVar14;
    local_c8 = __return_storage_ptr__;
    do {
      for (ppSVar16 = (pMVar7->integrableObjects_).
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          (ppSVar16 !=
           (pMVar7->integrableObjects_).
           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl
           .super__Vector_impl_data._M_finish && (pSVar4 = *ppSVar16, pSVar4 != (StuntDouble *)0x0))
          ; ppSVar16 = ppSVar16 + 1) {
        pSVar14 = pSVar4->snapshotMan_->currentSnapshot_;
        DVar11 = pSVar4->storage_;
        lVar15 = (long)pSVar4->localIndex_;
        lVar10 = *(long *)((long)&(pSVar14->atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + DVar11);
        pdVar9 = (double *)(lVar10 + lVar15 * 0x18);
        dVar23 = *pdVar9;
        dVar17 = pdVar9[1];
        dVar2 = *(double *)(lVar10 + 0x10 + lVar15 * 0x18);
        dVar24 = (dVar2 * dVar2 + dVar23 * dVar23 + dVar17 * dVar17) * pSVar4->mass_;
        if (pSVar4->objType_ - otDAtom < 2) {
          lVar10 = *(long *)((long)&(pSVar14->atomData).angularMomentum.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + DVar11);
          local_d8 = *(double *)(lVar10 + 0x10 + lVar15 * 0x18);
          puVar1 = (undefined4 *)(lVar10 + lVar15 * 0x18);
          local_e8 = *puVar1;
          uStack_e4 = puVar1[1];
          uStack_e0 = puVar1[2];
          uStack_dc = puVar1[3];
          local_f8 = dVar23;
          dStack_f0 = dVar17;
          (*pSVar4->_vptr_StuntDouble[5])(local_78,pSVar4);
          if (pSVar4->linear_ == true) {
            iVar3 = pSVar4->linearAxis_;
            uVar12 = (ulong)(((iVar3 + 1) / 3) * -3 + iVar3 + 1);
            uVar8 = (ulong)(iVar3 + ((iVar3 + 2) / 3) * -3 + 2);
            dVar23 = (*(double *)(&local_e8 + uVar12 * 2) * *(double *)(&local_e8 + uVar12 * 2)) /
                     local_78[uVar12 * 4];
            dVar17 = *(double *)(&local_e8 + uVar8 * 2) * *(double *)(&local_e8 + uVar8 * 2);
            pdVar9 = local_78 + uVar8 * 4;
          }
          else {
            auVar18._0_8_ =
                 (double)CONCAT44(uStack_e4,local_e8) * (double)CONCAT44(uStack_e4,local_e8);
            auVar18._8_8_ =
                 (double)CONCAT44(uStack_dc,uStack_e0) * (double)CONCAT44(uStack_dc,uStack_e0);
            auVar19._8_4_ = SUB84(local_78[4],0);
            auVar19._0_8_ = local_78[0];
            auVar19._12_4_ = (int)((ulong)local_78[4] >> 0x20);
            auVar19 = divpd(auVar18,auVar19);
            dVar23 = auVar19._8_8_ + auVar19._0_8_;
            dVar17 = local_d8 * local_d8;
            pdVar9 = local_78 + 8;
          }
          dVar24 = dVar24 + dVar17 / *pdVar9 + dVar23;
          if (pSVar4->objType_ != otRigidBody) {
            DVar11 = pSVar4->storage_;
            pSVar14 = pSVar4->snapshotMan_->currentSnapshot_;
            lVar15 = (long)pSVar4->localIndex_;
            dVar23 = local_f8;
            dVar17 = dStack_f0;
            goto LAB_001369e1;
          }
          lVar10 = __dynamic_cast(pSVar4,&StuntDouble::typeinfo,&RigidBody::typeinfo,0);
          plVar13 = *(long **)(lVar10 + 0x128);
          dVar5 = 0.0;
          dVar23 = local_f8;
          dVar17 = dStack_f0;
          if (plVar13 != *(long **)(lVar10 + 0x130)) {
            lVar15 = *plVar13;
            dVar5 = 0.0;
            while (lVar15 != 0) {
              plVar13 = plVar13 + 1;
              dVar5 = dVar5 + *(double *)
                               (*(long *)(*(long *)(*(long *)(lVar15 + 0x18) + 0x18) + 0x90 +
                                         *(long *)(lVar15 + 0x10)) +
                               (long)*(int *)(lVar15 + 0x30) * 8);
              if (plVar13 == *(long **)(lVar10 + 0x130)) break;
              lVar15 = *plVar13;
            }
          }
        }
        else {
LAB_001369e1:
          dVar5 = *(double *)
                   (*(long *)((long)&(pSVar14->atomData).particlePot.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + DVar11) + lVar15 * 8);
        }
        dVar24 = (dVar5 * 0.0004184 + dVar24) * 0.5;
        dVar21 = dVar21 + dVar24 * dVar23;
        dVar22 = dVar22 + dVar24 * dVar17;
        dVar20 = dVar20 + dVar24 * dVar2;
      }
      pMVar7 = SimInfo::nextMolecule(this->info_,&local_c0);
      pSVar14 = local_d0;
      __return_storage_ptr__ = local_c8;
    } while (pMVar7 != (Molecule *)0x0);
  }
  local_118[2] = dVar20;
  local_118[1] = dVar22;
  local_118[0] = dVar21;
  Snapshot::getConductiveHeatFlux(&local_138,pSVar14);
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  lVar10 = 0;
  do {
    local_98[lVar10] = local_138.super_Vector<double,_3U>.data_[lVar10] * 0.0004184;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  lVar10 = 0;
  do {
    local_b8[lVar10] = local_98[lVar10] + local_118[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  RVar6 = Snapshot::getVolume(this->info_->sman_->currentSnapshot_);
  local_138.super_Vector<double,_3U>.data_[0] = 0.0;
  local_138.super_Vector<double,_3U>.data_[1] = 0.0;
  local_138.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar10 = 0;
  do {
    local_138.super_Vector<double,_3U>.data_[lVar10] = local_b8[lVar10] / RVar6;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] =
       local_138.super_Vector<double,_3U>.data_[2];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] =
       local_138.super_Vector<double,_3U>.data_[0];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] =
       local_138.super_Vector<double,_3U>.data_[1];
  return __return_storage_ptr__;
}

Assistant:

Vector3d Thermo::getHeatFlux() {
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    SimInfo::MoleculeIterator miter;
    vector<StuntDouble*>::iterator iiter;
    Molecule* mol;
    StuntDouble* sd;
    RigidBody::AtomIterator ai;
    Atom* atom;
    Vector3d vel;
    Vector3d angMom;
    Mat3x3d I;
    int i;
    int j;
    int k;
    RealType mass;

    Vector3d x_a;
    RealType kinetic;
    RealType potential;
    RealType eatom;
    // Convective portion of the heat flux
    Vector3d heatFluxJc = V3Zero;

    /* Calculate convective portion of the heat flux */
    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        mass = sd->getMass();
        vel  = sd->getVel();

        kinetic = mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);

        if (sd->isDirectional()) {
          angMom = sd->getJ();
          I      = sd->getI();

          if (sd->isLinear()) {
            i = sd->linearAxis();
            j = (i + 1) % 3;
            k = (i + 2) % 3;
            kinetic += angMom[j] * angMom[j] / I(j, j) +
                       angMom[k] * angMom[k] / I(k, k);
          } else {
            kinetic += angMom[0] * angMom[0] / I(0, 0) +
                       angMom[1] * angMom[1] / I(1, 1) +
                       angMom[2] * angMom[2] / I(2, 2);
          }
        }

        potential = 0.0;

        if (sd->isRigidBody()) {
          RigidBody* rb = dynamic_cast<RigidBody*>(sd);
          for (atom = rb->beginAtom(ai); atom != NULL;
               atom = rb->nextAtom(ai)) {
            potential += atom->getParticlePot();
          }
        } else {
          potential = sd->getParticlePot();
        }

        potential *= Constants::energyConvert;  // amu A^2/fs^2
        // The potential may not be a 1/2 factor
        eatom = (kinetic + potential) / 2.0;  // amu A^2/fs^2
        heatFluxJc[0] += eatom * vel[0];      // amu A^3/fs^3
        heatFluxJc[1] += eatom * vel[1];      // amu A^3/fs^3
        heatFluxJc[2] += eatom * vel[2];      // amu A^3/fs^3
      }
    }

    /* The J_v vector is reduced in the forceManager so everyone has
     *  the global Jv. Jc is computed over the local atoms and must be
     *  reduced among all processors.
     */
#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &heatFluxJc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // (kcal/mol * A/fs) * conversion => (amu A^3)/fs^3

    Vector3d heatFluxJv =
        currSnapshot->getConductiveHeatFlux() * Constants::energyConvert;

    // Correct for the fact the flux is 1/V (Jc + Jv)
    return (heatFluxJv + heatFluxJc) / this->getVolume();  // amu / fs^3
  }